

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fan_calculator.cpp
# Opt level: O2

bool mahjong::is_division_branch_exist
               (intptr_t fixed_cnt,intptr_t step,division_t *work_division,division_result_t *result
               )

{
  division_result_t *pdVar1;
  bool bVar2;
  long lVar3;
  division_result_t *pdVar4;
  long lVar5;
  division_t temp;
  division_t *local_48;
  intptr_t local_40;
  intptr_t local_38;
  
  if (step < 3) {
    return false;
  }
  if (result->count < 1) {
    return false;
  }
  memcpy(temp.packs + fixed_cnt,work_division->packs + fixed_cnt,step * 2);
  std::__sort<unsigned_short*,__gnu_cxx::__ops::_Iter_less_iter>
            (temp.packs + fixed_cnt,temp.packs + step + fixed_cnt);
  lVar3 = result->count;
  lVar5 = lVar3 * 10;
  pdVar1 = (division_result_t *)(result->divisions + lVar3);
  local_48 = &temp;
  local_40 = fixed_cnt;
  local_38 = step;
  for (lVar3 = lVar3 >> 2; 0 < lVar3; lVar3 = lVar3 + -1) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
            ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                          *)&local_48,result->divisions);
    pdVar4 = result;
    if (bVar2) goto LAB_0011746e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
            ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                          *)&local_48,result->divisions + 1);
    pdVar4 = (division_result_t *)(result->divisions + 1);
    if (bVar2) goto LAB_0011746e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
            ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                          *)&local_48,result->divisions + 2);
    pdVar4 = (division_result_t *)(result->divisions + 2);
    if (bVar2) goto LAB_0011746e;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
            ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                          *)&local_48,result->divisions + 3);
    pdVar4 = (division_result_t *)(result->divisions + 3);
    if (bVar2) goto LAB_0011746e;
    result = (division_result_t *)(result->divisions + 4);
    lVar5 = lVar5 + -0x28;
  }
  lVar5 = lVar5 / 10;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      pdVar4 = pdVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
                  ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                                *)&local_48,result->divisions), pdVar4 = result, bVar2))
      goto LAB_0011746e;
      result = (division_result_t *)(result->divisions + 1);
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
            ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                          *)&local_48,result->divisions);
    pdVar4 = result;
    if (bVar2) goto LAB_0011746e;
    result = (division_result_t *)(result->divisions + 1);
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::$_0>
          ::operator()((_Iter_pred<mahjong::is_division_branch_exist(long,long,mahjong::(anonymous_namespace)::division_t_const*,mahjong::(anonymous_namespace)::division_result_t_const*)::__0>
                        *)&local_48,result->divisions);
  pdVar4 = result;
  if (!bVar2) {
    pdVar4 = pdVar1;
  }
LAB_0011746e:
  return pdVar4 != pdVar1;
}

Assistant:

static bool is_division_branch_exist(intptr_t fixed_cnt, intptr_t step, const division_t *work_division, const division_result_t *result) {
    // 没有划分时，以及划分步骤小于3时，不检测，因为至少要有3步递归才会产生不同划分
    if (result->count <= 0 || step < 3) {
        return false;
    }

    // std::includes要求有序
    // 这里不能直接在work_division->packs上排序，否则会破坏递归外层的数据
    division_t temp;
    memcpy(&temp.packs[fixed_cnt], &work_division->packs[fixed_cnt], step * sizeof(pack_t));
    std::sort(&temp.packs[fixed_cnt], &temp.packs[fixed_cnt + step]);

    // 只需要比较面子是否重复分支，雀头不参与比较，所以下标是4
    return std::any_of(&result->divisions[0], &result->divisions[result->count],
        [&temp, fixed_cnt, step](const division_t &od) {
        return std::includes(&od.packs[fixed_cnt], &od.packs[4], &temp.packs[fixed_cnt], &temp.packs[fixed_cnt + step]);
    });
}